

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_self(FuncState *fs,expdesc *e,expdesc *key)

{
  int B;
  uint A;
  int iVar1;
  int base;
  int ereg;
  expdesc *key_local;
  expdesc *e_local;
  FuncState *fs_local;
  
  luaK_exp2anyreg(fs,e);
  B = (e->u).info;
  freeexp(fs,e);
  A = (uint)fs->freereg;
  (e->u).info = A;
  e->k = VNONRELOC;
  luaK_reserveregs(fs,2);
  if (-1 < ((key->u).strval)->shrlen) {
    iVar1 = luaK_exp2K(fs,key);
    if (iVar1 != 0) {
      luaK_codeABCk(fs,OP_SELF,A,B,(key->u).info,0);
      goto LAB_0013d25d;
    }
  }
  luaK_exp2anyreg(fs,key);
  luaK_codeABCk(fs,OP_MOVE,A + 1,B,0,0);
  luaK_codeABCk(fs,OP_GETTABLE,A,B,(key->u).info,0);
LAB_0013d25d:
  freeexp(fs,key);
  return;
}

Assistant:

void luaK_self (FuncState *fs, expdesc *e, expdesc *key) {
  int ereg, base;
  luaK_exp2anyreg(fs, e);
  ereg = e->u.info;  /* register where 'e' (the receiver) was placed */
  freeexp(fs, e);
  base = e->u.info = fs->freereg;  /* base register for op_self */
  e->k = VNONRELOC;  /* self expression has a fixed register */
  luaK_reserveregs(fs, 2);  /* method and 'self' produced by op_self */
  lua_assert(key->k == VKSTR);
  /* is method name a short string in a valid K index? */
  if (strisshr(key->u.strval) && luaK_exp2K(fs, key)) {
    /* can use 'self' opcode */
    luaK_codeABCk(fs, OP_SELF, base, ereg, key->u.info, 0);
  }
  else {  /* cannot use 'self' opcode; use move+gettable */
    luaK_exp2anyreg(fs, key);  /* put method name in a register */
    luaK_codeABC(fs, OP_MOVE, base + 1, ereg, 0);  /* copy self to base+1 */
    luaK_codeABC(fs, OP_GETTABLE, base, ereg, key->u.info);  /* get method */
  }
  freeexp(fs, key);
}